

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
      *this,unsigned_long index)

{
  element_type *peVar1;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *in_RDI;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *this_00;
  string_type *__source;
  path *in_stack_ffffffffffffff70;
  FileManager *in_stack_ffffffffffffff78;
  string_type local_80 [4];
  format fVar2;
  
  this_00 = in_RDI;
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
                  *)in_RDI);
  peVar1 = std::
           __shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x294535);
  fVar2 = (format)((ulong)peVar1 >> 0x38);
  __source = local_80;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
              *)this_00);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff70,__source,fVar2);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(uint64_t)__source);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_4224UL,_void>
  ::next((InputIterator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_4224UL,_void>
          *)this_00);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_4224UL,_void>
  ::~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_4224UL,_void>
                    *)0x2945ad);
  std::filesystem::__cxx11::path::~path((path *)in_RDI);
  std::__cxx11::string::~string((string *)local_80);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x2945ce);
  return this_00;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }